

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

Result<wallet::CreatedTransactionResult> *
wallet::FundTransaction
          (Result<wallet::CreatedTransactionResult> *__return_storage_ptr__,CWallet *wallet,
          CMutableTransaction *tx,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *vecSend,
          optional<unsigned_int> change_pos,bool lockUnspents,CCoinControl *coinControl)

{
  pointer pCVar1;
  element_type *peVar2;
  long outpoint;
  isminetype iVar3;
  Chain *pCVar4;
  PreselectedInput *this;
  mapped_type *pmVar5;
  CTxOut *txout;
  T *pTVar6;
  CTxIn *txin;
  pointer pCVar7;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CScriptWitness *script_wit;
  long in_FS_OFFSET;
  Result<wallet::CreatedTransactionResult> *res;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  unique_lock<std::recursive_mutex> local_b8;
  bilingual_str local_a8;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    __assert_fail("tx.vout.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                  ,0x58d,
                  "util::Result<CreatedTransactionResult> wallet::FundTransaction(CWallet &, const CMutableTransaction &, const std::vector<CRecipient> &, std::optional<unsigned int>, bool, CCoinControl)"
                 );
  }
  (coinControl->m_locktime).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)((ulong)tx->nLockTime | 0x100000000);
  (coinControl->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)((ulong)tx->version | 0x100000000);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_b8,&wallet->cs_wallet,
             "wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
             ,0x597,false);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar7 != pCVar1; pCVar7 = pCVar7 + 1) {
    std::
    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
    operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                *)&local_68,&pCVar7->prevout);
  }
  pCVar4 = CWallet::chain(wallet);
  (*pCVar4->_vptr_Chain[0xf])(pCVar4,&local_68);
  pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  script_wit = &((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness;
  do {
    outpoint = (long)(script_wit + -4) + 0x10;
    if ((pointer)outpoint == pCVar7) {
      CreateTransaction(__return_storage_ptr__,wallet,vecSend,change_pos,coinControl,false);
      if (lockUnspents &&
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
          '\x01') {
        pTVar6 = util::Result<wallet::CreatedTransactionResult>::value(__return_storage_ptr__);
        peVar2 = (pTVar6->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pCVar1 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pCVar7 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start; pCVar7 != pCVar1; pCVar7 = pCVar7 + 1) {
          CWallet::LockCoin(wallet,&pCVar7->prevout,(WalletBatch *)0x0);
        }
      }
LAB_009905f2:
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree(&local_68);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    this = CCoinControl::Select(coinControl,(COutPoint *)outpoint);
    iVar3 = CWallet::IsMine(wallet,(COutPoint *)outpoint);
    if (iVar3 == ISMINE_NO) {
      pmVar5 = std::
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                             *)&local_68,(key_type *)outpoint);
      if ((pmVar5->out).nValue == -1) {
        _(&local_a8,(ConstevalStringLiteral)0xe1a355);
        std::__detail::__variant::
        _Variant_storage<false,bilingual_str,wallet::CreatedTransactionResult>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::CreatedTransactionResult> *)
                   __return_storage_ptr__,&local_a8);
        bilingual_str::~bilingual_str(&local_a8);
        goto LAB_009905f2;
      }
      txout = &std::
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                             *)&local_68,(key_type *)outpoint)->out;
      PreselectedInput::SetTxOut(this,txout);
    }
    PreselectedInput::SetSequence(this,*(uint32_t *)((long)(script_wit + -1) + 0x10));
    PreselectedInput::SetScriptSig(this,(CScript *)((long)(script_wit + -2) + 8));
    PreselectedInput::SetScriptWitness(this,script_wit);
    script_wit = (CScriptWitness *)((long)(script_wit + 4) + 8);
  } while( true );
}

Assistant:

util::Result<CreatedTransactionResult> FundTransaction(CWallet& wallet, const CMutableTransaction& tx, const std::vector<CRecipient>& vecSend, std::optional<unsigned int> change_pos, bool lockUnspents, CCoinControl coinControl)
{
    // We want to make sure tx.vout is not used now that we are passing outputs as a vector of recipients.
    // This sets us up to remove tx completely in a future PR in favor of passing the inputs directly.
    assert(tx.vout.empty());

    // Set the user desired locktime
    coinControl.m_locktime = tx.nLockTime;

    // Set the user desired version
    coinControl.m_version = tx.version;

    // Acquire the locks to prevent races to the new locked unspents between the
    // CreateTransaction call and LockCoin calls (when lockUnspents is true).
    LOCK(wallet.cs_wallet);

    // Fetch specified UTXOs from the UTXO set to get the scriptPubKeys and values of the outputs being selected
    // and to match with the given solving_data. Only used for non-wallet outputs.
    std::map<COutPoint, Coin> coins;
    for (const CTxIn& txin : tx.vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    wallet.chain().findCoins(coins);

    for (const CTxIn& txin : tx.vin) {
        const auto& outPoint = txin.prevout;
        PreselectedInput& preset_txin = coinControl.Select(outPoint);
        if (!wallet.IsMine(outPoint)) {
            if (coins[outPoint].out.IsNull()) {
                return util::Error{_("Unable to find UTXO for external input")};
            }

            // The input was not in the wallet, but is in the UTXO set, so select as external
            preset_txin.SetTxOut(coins[outPoint].out);
        }
        preset_txin.SetSequence(txin.nSequence);
        preset_txin.SetScriptSig(txin.scriptSig);
        preset_txin.SetScriptWitness(txin.scriptWitness);
    }

    auto res = CreateTransaction(wallet, vecSend, change_pos, coinControl, false);
    if (!res) {
        return res;
    }

    if (lockUnspents) {
        for (const CTxIn& txin : res->tx->vin) {
            wallet.LockCoin(txin.prevout);
        }
    }

    return res;
}